

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buffer.cpp
# Opt level: O0

int mpp_buffer_get_fd_with_caller(MppBuffer buffer,char *caller)

{
  undefined8 in_stack_ffffffffffffffc8;
  int fd;
  MppBufferImpl *p;
  char *caller_local;
  MppBuffer buffer_local;
  
  if (buffer == (MppBuffer)0x0) {
    _mpp_log_l(2,"mpp_buffer","mpp_buffer_get_fd invalid NULL input from %s\n",(char *)0x0,caller);
    buffer_local._4_4_ = 0xffffffff;
  }
  else {
    buffer_local._4_4_ = *(uint *)((long)buffer + 0xa0);
    if (((int)buffer_local._4_4_ < 0) &&
       (_mpp_log_l(2,"mpp_buffer","Assertion %s failed at %s:%d\n",(char *)0x0,"fd >= 0",
                   "mpp_buffer_get_fd_with_caller",
                   CONCAT44((int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),0xc2)),
       (mpp_debug & 0x10000000) != 0)) {
      abort();
    }
    if ((int)buffer_local._4_4_ < 0) {
      _mpp_log_l(2,"mpp_buffer","mpp_buffer_get_fd buffer %p fd %d from %s\n",(char *)0x0,buffer,
                 (ulong)buffer_local._4_4_,caller);
    }
  }
  return buffer_local._4_4_;
}

Assistant:

int mpp_buffer_get_fd_with_caller(MppBuffer buffer, const char *caller)
{
    if (NULL == buffer) {
        mpp_err("mpp_buffer_get_fd invalid NULL input from %s\n", caller);
        return -1;
    }

    MppBufferImpl *p = (MppBufferImpl*)buffer;
    int fd = p->info.fd;
    mpp_assert(fd >= 0);
    if (fd < 0)
        mpp_err("mpp_buffer_get_fd buffer %p fd %d from %s\n", buffer, fd, caller);

    return fd;
}